

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O3

FT_Error FT_Outline_New_Internal
                   (FT_Memory memory,FT_UInt numPoints,FT_Int numContours,FT_Outline *anoutline)

{
  FT_Error FVar1;
  FT_Vector *__s;
  char *__s_00;
  short *psVar2;
  ulong __n;
  FT_Error local_38;
  char local_31;
  
  if (memory == (FT_Memory)0x0 || anoutline == (FT_Outline *)0x0) {
    return 6;
  }
  anoutline->tags = (char *)0x0;
  anoutline->contours = (short *)0x0;
  anoutline->n_contours = 0;
  anoutline->n_points = 0;
  *(undefined4 *)&anoutline->field_0x4 = 0;
  anoutline->points = (FT_Vector *)0x0;
  *(undefined8 *)&anoutline->flags = 0;
  if (numPoints < (uint)numContours || numContours < 0) {
    return 6;
  }
  if (0x7fff < numPoints) {
    return 10;
  }
  if (numPoints == 0) {
    __s_00 = (char *)0x0;
LAB_001eea44:
    local_38 = 0;
    anoutline->tags = __s_00;
  }
  else {
    __n = (ulong)numPoints;
    __s = (FT_Vector *)(*memory->alloc)(memory,__n << 4);
    if (__s == (FT_Vector *)0x0) {
      anoutline->points = (FT_Vector *)0x0;
      FVar1 = 0x40;
      goto LAB_001eeaae;
    }
    local_31 = numPoints == 0;
    memset(__s,0,__n << 4);
    anoutline->points = __s;
    __s_00 = (char *)(*memory->alloc)(memory,__n);
    if (__s_00 != (char *)0x0 && local_31 == '\0') {
      memset(__s_00,0,__n);
      goto LAB_001eea44;
    }
    FVar1 = (uint)(__s_00 == (char *)0x0) << 6;
    anoutline->tags = __s_00;
    local_38 = FVar1;
    if (__s_00 == (char *)0x0) goto LAB_001eeaae;
  }
  psVar2 = (short *)ft_mem_realloc(memory,2,0,(ulong)(uint)numContours,(void *)0x0,&local_38);
  anoutline->contours = psVar2;
  FVar1 = local_38;
  if (local_38 == 0) {
    anoutline->n_points = (short)numPoints;
    anoutline->n_contours = (short)numContours;
    *(byte *)&anoutline->flags = (byte)anoutline->flags | 1;
    return 0;
  }
LAB_001eeaae:
  *(byte *)&anoutline->flags = (byte)anoutline->flags | 1;
  FT_Outline_Done_Internal(memory,anoutline);
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_New_Internal( FT_Memory    memory,
                           FT_UInt      numPoints,
                           FT_Int       numContours,
                           FT_Outline  *anoutline )
  {
    FT_Error  error;


    if ( !anoutline || !memory )
      return FT_THROW( Invalid_Argument );

    *anoutline = null_outline;

    if ( numContours < 0                  ||
         (FT_UInt)numContours > numPoints )
      return FT_THROW( Invalid_Argument );

    if ( numPoints > FT_OUTLINE_POINTS_MAX )
      return FT_THROW( Array_Too_Large );

    if ( FT_NEW_ARRAY( anoutline->points,   numPoints   ) ||
         FT_NEW_ARRAY( anoutline->tags,     numPoints   ) ||
         FT_NEW_ARRAY( anoutline->contours, numContours ) )
      goto Fail;

    anoutline->n_points    = (FT_Short)numPoints;
    anoutline->n_contours  = (FT_Short)numContours;
    anoutline->flags      |= FT_OUTLINE_OWNER;

    return FT_Err_Ok;

  Fail:
    anoutline->flags |= FT_OUTLINE_OWNER;
    FT_Outline_Done_Internal( memory, anoutline );

    return error;
  }